

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void cdef_reset_job_info(AV1CdefSync *cdef_sync)

{
  long *in_RDI;
  
  if (*in_RDI != 0) {
    pthread_mutex_init((pthread_mutex_t *)*in_RDI,(pthread_mutexattr_t *)0x0);
  }
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  *(undefined4 *)(in_RDI + 3) = 0;
  *(undefined1 *)((long)in_RDI + 0x1c) = 0;
  return;
}

Assistant:

static inline void cdef_reset_job_info(AV1CdefSync *cdef_sync) {
#if CONFIG_MULTITHREAD
  if (cdef_sync->mutex_) pthread_mutex_init(cdef_sync->mutex_, NULL);
#endif  // CONFIG_MULTITHREAD
  cdef_sync->end_of_frame = 0;
  cdef_sync->fbr = 0;
  cdef_sync->fbc = 0;
  cdef_sync->cdef_mt_exit = false;
}